

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

void __thiscall
slang::ast::SampledValueExprVisitor::visit<slang::ast::LValueReferenceExpression>
          (SampledValueExprVisitor *this,LValueReferenceExpression *expr)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  bool bVar1;
  KnownSystemName KVar2;
  Symbol *pSVar3;
  Expression *in_RSI;
  long in_RDI;
  KnownSystemName ksn;
  CallExpression *call;
  Symbol *sym;
  bool local_a1;
  undefined4 in_stack_ffffffffffffff68;
  ExpressionKind EVar4;
  ASTContext *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  KnownSystemName in_stack_ffffffffffffff84;
  SourceLocation in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  DiagCode code;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> in_stack_ffffffffffffffa0;
  
  code = SUB84((ulong)in_stack_ffffffffffffff90 >> 0x20,0);
  EVar4 = in_RSI->kind;
  if (EVar4 == NamedValue) {
    pSVar3 = Expression::getSymbolReference
                       ((Expression *)
                        in_stack_ffffffffffffffa0._M_extent._M_extent_value._M_extent_value,
                        in_stack_ffffffffffffffa0._M_ptr._7_1_);
    if (pSVar3 != (Symbol *)0x0) {
      if (pSVar3->kind != LocalAssertionVar) {
        if (pSVar3->kind != AssertionPort) {
          return;
        }
        Symbol::as<slang::ast::AssertionPortSymbol>((Symbol *)0x7dc7a7);
        bVar1 = AssertionPortSymbol::isLocalVar((AssertionPortSymbol *)0x7dc7af);
        if (!bVar1) {
          return;
        }
      }
      sourceRange.startLoc._4_4_ = in_stack_ffffffffffffff84;
      sourceRange.startLoc._0_4_ = in_stack_ffffffffffffff80;
      sourceRange.endLoc = in_stack_ffffffffffffff88;
      ASTContext::addDiag(in_stack_ffffffffffffff78,code,sourceRange);
    }
  }
  else if (EVar4 == Call) {
    Expression::as<slang::ast::CallExpression>(in_RSI);
    bVar1 = CallExpression::isSystemCall((CallExpression *)0x7dc820);
    if (bVar1) {
      KVar2 = CallExpression::getKnownSystemName
                        ((CallExpression *)CONCAT44(EVar4,in_stack_ffffffffffffff68));
      local_a1 = false;
      if (KVar2 == Matched) {
        CallExpression::arguments((CallExpression *)0x7dc84e);
        bVar1 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::empty
                          ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                           0x7dc862);
        local_a1 = false;
        if (!bVar1) {
          CallExpression::arguments((CallExpression *)0x7dc879);
          std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                    ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                     &stack0xffffffffffffffa0,0);
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0x7dc89d);
          local_a1 = Type::isSequenceType((Type *)0x7dc8a5);
        }
      }
      if (local_a1 != false) {
        in_stack_ffffffffffffff88 = (in_RSI->sourceRange).startLoc;
        code = SUB84((in_RSI->sourceRange).endLoc,4);
        sourceRange_00.startLoc._4_4_ = in_stack_ffffffffffffff84;
        sourceRange_00.startLoc._0_4_ = in_stack_ffffffffffffff80;
        sourceRange_00.endLoc = in_stack_ffffffffffffff88;
        ASTContext::addDiag(in_stack_ffffffffffffff78,code,sourceRange_00);
      }
      if (((*(byte *)(in_RDI + 8) & 1) != 0) &&
         (bVar1 = SemanticFacts::isGlobalFutureSampledValueFunc(in_stack_ffffffffffffff84), bVar1))
      {
        sourceRange_01.startLoc._4_4_ = 0x1d0008;
        sourceRange_01.startLoc._0_4_ = in_stack_ffffffffffffff80;
        sourceRange_01.endLoc = in_stack_ffffffffffffff88;
        ASTContext::addDiag((ASTContext *)(in_RSI->sourceRange).endLoc,code,sourceRange_01);
      }
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                    if (auto sym = expr.getSymbolReference()) {
                        if (sym->kind == SymbolKind::LocalAssertionVar ||
                            (sym->kind == SymbolKind::AssertionPort &&
                             sym->template as<AssertionPortSymbol>().isLocalVar())) {
                            context.addDiag(localVarCode, expr.sourceRange);
                        }
                    }
                    break;
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.isSystemCall()) {
                        auto ksn = call.getKnownSystemName();
                        if (ksn == KnownSystemName::Matched && !call.arguments().empty() &&
                            call.arguments()[0]->type->isSequenceType()) {
                            context.addDiag(matchedCode, expr.sourceRange);
                        }

                        if (isFutureGlobal && SemanticFacts::isGlobalFutureSampledValueFunc(ksn))
                            context.addDiag(diag::GlobalSampledValueNested, expr.sourceRange);
                    }
                    break;
                }
                default:
                    if constexpr (HasVisitExprs<T, SampledValueExprVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }